

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O0

void lib::io::ReadByFormat(StackAPI *api,FILE *file,string *format)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pvVar4;
  StackAPI *this;
  size_type sVar5;
  FILE *in_RSI;
  char *in_RDI;
  size_type size;
  vector<char,_std::allocator<char>_> buf_1;
  size_t count;
  size_t part_count;
  size_t part;
  vector<char,_std::allocator<char>_> buf;
  long bytes;
  long cur;
  double num;
  char *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  StackAPI *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  allocator<char> *__n;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_91;
  vector<char,_std::allocator<char>_> local_90;
  size_type local_78;
  undefined8 local_70;
  undefined8 local_68;
  allocator<char> local_49;
  vector<char,_std::allocator<char>_> local_48;
  size_t local_30;
  long local_28;
  undefined8 local_20 [2];
  FILE *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                          in_stack_ffffffffffffff08);
  if (bVar1) {
    local_20[0] = 0;
    iVar2 = __isoc99_fscanf(local_10,"%lg",local_20);
    if (iVar2 == 1) {
      luna::StackAPI::PushNumber
                ((StackAPI *)
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                 (double)in_stack_ffffffffffffff08);
    }
    else {
      luna::StackAPI::PushNil((StackAPI *)0x162b67);
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff17,
                                     CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                            in_stack_ffffffffffffff08);
    if (bVar1) {
      local_28 = ftell(local_10);
      fseek(local_10,0,2);
      lVar3 = ftell(local_10);
      local_30 = lVar3 - local_28;
      fseek(local_10,local_28,0);
      if (local_30 == 0) {
        luna::StackAPI::PushString(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      else {
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (allocator_type *)in_stack_ffffffffffffff20);
        std::allocator<char>::~allocator(&local_49);
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        local_30 = fread(pvVar4,1,local_30,local_10);
        std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        luna::StackAPI::PushString
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   CONCAT17(in_stack_ffffffffffffff17,
                            CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20);
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff17,
                                       CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)
                                      ),in_stack_ffffffffffffff08);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff17,
                                              CONCAT16(in_stack_ffffffffffffff16,
                                                       in_stack_ffffffffffffff10)),
                                  in_stack_ffffffffffffff08), bVar1)) {
        local_68 = 0x80;
        local_70 = 0x81;
        local_78 = 0;
        __n = &local_91;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  (in_stack_ffffffffffffff30,(size_type)__n,
                   (allocator_type *)in_stack_ffffffffffffff20);
        std::allocator<char>::~allocator(&local_91);
        while( true ) {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_78);
          this = (StackAPI *)fgets(pvVar4,0x81,local_10);
          if (this == (StackAPI *)0x0) break;
          sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_90);
          while( true ) {
            in_stack_ffffffffffffff17 = false;
            if (local_78 < sVar5 - 1) {
              pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_78);
              in_stack_ffffffffffffff17 = false;
              if (*pvVar4 != '\n') {
                pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_78);
                in_stack_ffffffffffffff17 = *pvVar4 != '\0';
              }
            }
            if ((bool)in_stack_ffffffffffffff17 == false) break;
            local_78 = local_78 + 1;
          }
          if (local_78 != sVar5 - 1) {
            pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,local_78);
            if ((*pvVar4 == '\n') &&
               (in_stack_ffffffffffffff16 =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffff17,
                                                 CONCAT16(in_stack_ffffffffffffff16,
                                                          in_stack_ffffffffffffff10)),
                                     in_stack_ffffffffffffff08), (bool)in_stack_ffffffffffffff16)) {
              local_78 = local_78 + 1;
            }
            std::vector<char,_std::allocator<char>_>::operator[](&local_90,0);
            luna::StackAPI::PushString
                      (this,in_stack_ffffffffffffff18,
                       CONCAT17(in_stack_ffffffffffffff17,
                                CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
            goto LAB_00162fca;
          }
          std::vector<char,_std::allocator<char>_>::resize(in_stack_ffffffffffffff30,(size_type)__n)
          ;
        }
        if (local_78 == 0) {
          luna::StackAPI::PushNil((StackAPI *)0x162dfc);
        }
        else {
          std::vector<char,_std::allocator<char>_>::operator[](&local_90,0);
          luna::StackAPI::PushString
                    (this,local_8,
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
        }
LAB_00162fca:
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)this);
      }
      else {
        luna::StackAPI::PushNil((StackAPI *)0x162fe3);
      }
    }
  }
  return;
}

Assistant:

void ReadByFormat(luna::StackAPI &api, std::FILE *file,
                      const std::string format)
    {
        if (format == "*n")
        {
            // Read a number
            double num = 0.0;
            if (std::fscanf(file, "%lg", &num) == 1)
                api.PushNumber(num);
            else
                api.PushNil();
        }
        else if (format == "*a")
        {
            // Read total content of file
            auto cur = std::ftell(file);
            std::fseek(file, 0, SEEK_END);
            auto bytes = std::ftell(file) - cur;
            std::fseek(file, cur, SEEK_SET);
            if (bytes == 0)
                api.PushString("");
            else
            {
                std::vector<char> buf(bytes);
                bytes = std::fread(&buf[0], sizeof(buf[0]), bytes, file);
                api.PushString(&buf[0], bytes);
            }
        }
        else if (format == "*l" || format == "*L")
        {
            // Read line
            const std::size_t part = 128;
            const std::size_t part_count = part + 1;

            std::size_t count = 0;
            std::vector<char> buf(part_count);
            do
            {
                if (!std::fgets(&buf[count], part_count, file))
                {
                    // EOF or an error occured
                    // if count is 0, push a nil as end of file
                    // otherwise, push the buf as string
                    if (count == 0)
                        api.PushNil();
                    else
                        api.PushString(&buf[0], count);
                    break;
                }
                else
                {
                    auto size = buf.size();
                    while (count < size - 1 &&
                            buf[count] != '\n' && buf[count] != '\0')
                        ++count;
                    // buf[size - 1] must be '\0'
                    if (count == size - 1)
                    {
                        // '\n' is not exist, extend buf to continue read
                        buf.resize(size + part);
                    }
                    else
                    {
                        // If buf[count] is '\n', keep '\n' when
                        // format is "*L"
                        if (buf[count] == '\n' && format == "*L") ++count;
                        api.PushString(&buf[0], count);
                        break;
                    }
                }
            } while (true);
        }
        else
            api.PushNil();
    }